

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_os_environ(uv_env_item_t **envitems,int *count)

{
  long lVar1;
  int iVar2;
  uv_env_item_t *puVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  size_t __nmemb;
  size_t sVar8;
  
  *envitems = (uv_env_item_t *)0x0;
  *count = 0;
  __nmemb = 0xffffffffffffffff;
  do {
    lVar1 = __nmemb * 8;
    __nmemb = __nmemb + 1;
  } while (*(long *)(_environ + 8 + lVar1) != 0);
  puVar3 = (uv_env_item_t *)uv__calloc(__nmemb,0x10);
  *envitems = puVar3;
  if (puVar3 == (uv_env_item_t *)0x0) {
    iVar2 = -0xc;
  }
  else {
    if (__nmemb != 0) {
      sVar8 = 0;
      uVar7 = 0;
LAB_0075cc62:
      pcVar4 = *(char **)(_environ + sVar8 * 8);
      if (pcVar4 != (char *)0x0) {
        pcVar4 = uv__strdup(pcVar4);
        if (pcVar4 != (char *)0x0) goto code_r0x0075cc78;
        if (0 < (int)uVar7) {
          uVar6 = (ulong)uVar7;
          do {
            uv__free((*envitems)[uVar6].name);
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        uv__free(*envitems);
        *envitems = (uv_env_item_t *)0x0;
        iVar2 = -0xc;
        uVar7 = 0;
        goto LAB_0075cd04;
      }
      goto LAB_0075cccc;
    }
    uVar7 = 0;
LAB_0075cccc:
    iVar2 = 0;
LAB_0075cd04:
    *count = uVar7;
  }
  return iVar2;
code_r0x0075cc78:
  pcVar5 = strchr(pcVar4,0x3d);
  if (pcVar5 == (char *)0x0) {
    uv__free(pcVar4);
  }
  else {
    *pcVar5 = '\0';
    puVar3 = *envitems;
    puVar3[(int)uVar7].name = pcVar4;
    puVar3[(int)uVar7].value = pcVar5 + 1;
    uVar7 = uVar7 + 1;
  }
  sVar8 = sVar8 + 1;
  if (__nmemb == sVar8) goto LAB_0075cccc;
  goto LAB_0075cc62;
}

Assistant:

int uv_os_environ(uv_env_item_t** envitems, int* count) {
  int i, j, cnt;
  uv_env_item_t* envitem;

  *envitems = NULL;
  *count = 0;

  for (i = 0; environ[i] != NULL; i++);

  *envitems = uv__calloc(i, sizeof(**envitems));

  if (*envitems == NULL)
    return UV_ENOMEM;

  for (j = 0, cnt = 0; j < i; j++) {
    char* buf;
    char* ptr;

    if (environ[j] == NULL)
      break;

    buf = uv__strdup(environ[j]);
    if (buf == NULL)
      goto fail;

    ptr = strchr(buf, '=');
    if (ptr == NULL) {
      uv__free(buf);
      continue;
    }

    *ptr = '\0';

    envitem = &(*envitems)[cnt];
    envitem->name = buf;
    envitem->value = ptr + 1;

    cnt++;
  }

  *count = cnt;
  return 0;

fail:
  for (i = 0; i < cnt; i++) {
    envitem = &(*envitems)[cnt];
    uv__free(envitem->name);
  }
  uv__free(*envitems);

  *envitems = NULL;
  *count = 0;
  return UV_ENOMEM;
}